

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrfmt.cpp
# Opt level: O2

int32_t uprv_itou_63(UChar *buffer,int32_t capacity,uint32_t i,uint32_t radix,int32_t minwidth)

{
  short sVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  UChar UVar6;
  
  uVar3 = 0;
  lVar5 = 2;
  do {
    lVar4 = lVar5;
    sVar1 = (short)((ulong)i % (ulong)radix);
    UVar6 = sVar1 + L'0';
    if (9 < (int)((ulong)i % (ulong)radix)) {
      UVar6 = sVar1 + L'7';
    }
    buffer[uVar3] = UVar6;
    uVar3 = uVar3 + 1;
    if (i < radix) break;
    lVar5 = lVar4 + 2;
    i = i / radix;
  } while ((long)uVar3 < (long)capacity);
  for (; (long)uVar3 < (long)minwidth; uVar3 = uVar3 + 1) {
    buffer[uVar3] = L'0';
    lVar4 = lVar4 + 2;
  }
  if ((int32_t)uVar3 < capacity) {
    buffer[uVar3] = L'\0';
  }
  lVar5 = (lVar4 << 0x1f) >> 0x1f;
  for (uVar2 = 0; lVar5 = lVar5 + -2, uVar2 < (uVar3 >> 1 & 0x7fffffff); uVar2 = uVar2 + 1) {
    UVar6 = *(UChar *)((long)buffer + lVar5);
    *(UChar *)((long)buffer + lVar5) = buffer[uVar2];
    buffer[uVar2] = UVar6;
  }
  return (int32_t)uVar3;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_itou (UChar * buffer, int32_t capacity,
           uint32_t i, uint32_t radix, int32_t minwidth)
{
    int32_t length = 0;
    int digit;
    int32_t j;
    UChar temp;

    do{
        digit = (int)(i % radix);
        buffer[length++]=(UChar)(digit<=9?(0x0030+digit):(0x0030+digit+7));
        i=i/radix;
    } while(i && length<capacity);

    while (length < minwidth){
        buffer[length++] = (UChar) 0x0030;/*zero padding */
    }
    /* null terminate the buffer */
    if(length<capacity){
        buffer[length] = (UChar) 0x0000;
    }

    /* Reverses the string */
    for (j = 0; j < (length / 2); j++){
        temp = buffer[(length-1) - j];
        buffer[(length-1) - j] = buffer[j];
        buffer[j] = temp;
    }
    return length;
}